

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NearestNeighborsIndex::MergeFrom
          (NearestNeighborsIndex *this,NearestNeighborsIndex *from)

{
  void *pvVar1;
  LogMessage *other;
  LinearIndex *pLVar2;
  SingleKdTreeIndex *pSVar3;
  SquaredEuclideanDistance *pSVar4;
  LinearIndex *from_00;
  SingleKdTreeIndex *from_01;
  SquaredEuclideanDistance *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NearestNeighbors.pb.cc"
               ,0x5a7);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
            (&(this->floatsamples_).super_RepeatedPtrFieldBase,
             &(from->floatsamples_).super_RepeatedPtrFieldBase);
  if (from->numberofdimensions_ != 0) {
    this->numberofdimensions_ = from->numberofdimensions_;
  }
  if (from->_oneof_case_[0] == 0x6e) {
    if (this->_oneof_case_[0] != 0x6e) {
      clear_IndexType(this);
      this->_oneof_case_[0] = 0x6e;
      pSVar3 = (SingleKdTreeIndex *)operator_new(0x18);
      SingleKdTreeIndex::SingleKdTreeIndex(pSVar3);
      (this->IndexType_).singlekdtreeindex_ = pSVar3;
    }
    pSVar3 = (this->IndexType_).singlekdtreeindex_;
    if (from->_oneof_case_[0] == 0x6e) {
      from_01 = (from->IndexType_).singlekdtreeindex_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_01 = (SingleKdTreeIndex *)&_SingleKdTreeIndex_default_instance_;
    }
    SingleKdTreeIndex::MergeFrom(pSVar3,from_01);
  }
  else if (from->_oneof_case_[0] == 100) {
    if (this->_oneof_case_[0] != 100) {
      clear_IndexType(this);
      this->_oneof_case_[0] = 100;
      pLVar2 = (LinearIndex *)operator_new(0x18);
      LinearIndex::LinearIndex(pLVar2);
      (this->IndexType_).linearindex_ = pLVar2;
    }
    pLVar2 = (this->IndexType_).linearindex_;
    if (from->_oneof_case_[0] == 100) {
      from_00 = (from->IndexType_).linearindex_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_00 = (LinearIndex *)&_LinearIndex_default_instance_;
    }
    LinearIndex::MergeFrom(pLVar2,from_00);
  }
  if (from->_oneof_case_[1] == 200) {
    if (this->_oneof_case_[1] != 200) {
      this->_oneof_case_[1] = 200;
      pSVar4 = (SquaredEuclideanDistance *)operator_new(0x18);
      SquaredEuclideanDistance::SquaredEuclideanDistance(pSVar4);
      (this->DistanceFunction_).squaredeuclideandistance_ = pSVar4;
    }
    pSVar4 = (this->DistanceFunction_).squaredeuclideandistance_;
    if (from->_oneof_case_[1] == 200) {
      from_02 = (from->DistanceFunction_).squaredeuclideandistance_;
    }
    else {
      protobuf_NearestNeighbors_2eproto::InitDefaults();
      from_02 = (SquaredEuclideanDistance *)&_SquaredEuclideanDistance_default_instance_;
    }
    SquaredEuclideanDistance::MergeFrom(pSVar4,from_02);
  }
  return;
}

Assistant:

void NearestNeighborsIndex::MergeFrom(const NearestNeighborsIndex& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.NearestNeighborsIndex)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  floatsamples_.MergeFrom(from.floatsamples_);
  if (from.numberofdimensions() != 0) {
    set_numberofdimensions(from.numberofdimensions());
  }
  switch (from.IndexType_case()) {
    case kLinearIndex: {
      mutable_linearindex()->::CoreML::Specification::LinearIndex::MergeFrom(from.linearindex());
      break;
    }
    case kSingleKdTreeIndex: {
      mutable_singlekdtreeindex()->::CoreML::Specification::SingleKdTreeIndex::MergeFrom(from.singlekdtreeindex());
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  switch (from.DistanceFunction_case()) {
    case kSquaredEuclideanDistance: {
      mutable_squaredeuclideandistance()->::CoreML::Specification::SquaredEuclideanDistance::MergeFrom(from.squaredeuclideandistance());
      break;
    }
    case DISTANCEFUNCTION_NOT_SET: {
      break;
    }
  }
}